

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O0

shared_ptr<Buffer> __thiscall qpdf::Stream::getStreamDataBuffer(Stream *this)

{
  Members *pMVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Stream *in_RSI;
  shared_ptr<Buffer> sVar2;
  Stream *this_local;
  
  pMVar1 = stream(in_RSI);
  std::shared_ptr<Buffer>::shared_ptr((shared_ptr<Buffer> *)this,&pMVar1->stream_data);
  sVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Buffer>)sVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Buffer>
        getStreamDataBuffer() const
        {
            return stream()->stream_data;
        }